

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u32 sqlite3IsTrueOrFalse(char *zIn)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    bVar1 = zIn[lVar2];
    if (bVar1 == "true"[lVar2]) {
      if ((ulong)bVar1 == 0) {
        return 0x10000000;
      }
    }
    else if (""[bVar1] != ""[(byte)"true"[lVar2]]) {
      lVar2 = 0;
      do {
        bVar1 = zIn[lVar2];
        if (bVar1 == "false"[lVar2]) {
          if ((ulong)bVar1 == 0) {
            return 0x20000000;
          }
        }
        else if (""[bVar1] != ""[(byte)"false"[lVar2]]) {
          return 0;
        }
        lVar2 = lVar2 + 1;
      } while( true );
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE u32 sqlite3IsTrueOrFalse(const char *zIn){
  if( sqlite3StrICmp(zIn, "true")==0  ) return EP_IsTrue;
  if( sqlite3StrICmp(zIn, "false")==0 ) return EP_IsFalse;
  return 0;
}